

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepthImage.cpp
# Opt level: O2

DepthImage * __thiscall DepthImage::operator+=(DepthImage *this,DepthImage *oth)

{
  float *pfVar1;
  float fVar2;
  pointer pRVar3;
  pointer pRVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  iVar5 = (this->color).m_Size.x;
  iVar6 = (this->color).m_Size.y;
  iVar7 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar7 != iVar6; iVar7 = iVar7 + 1) {
    lVar8 = (long)iVar7;
    for (lVar9 = 0; iVar5 != (int)lVar9; lVar9 = lVar9 + 1) {
      lVar10 = (this->depth).m_Size.x * lVar8 + lVar9;
      pRVar3 = (this->depth).m_Data.
               super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = (oth->depth).m_Size.x * lVar8 + lVar9;
      pRVar4 = (oth->depth).m_Data.super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>
               ._M_impl.super__Vector_impl_data._M_start;
      fVar2 = *(float *)((long)&half::_toFloat + (ulong)pRVar4[lVar11].r._h * 4);
      pfVar1 = (float *)((long)&half::_toFloat + (ulong)pRVar3[lVar10].r._h * 4);
      if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
        (this->color).m_Data.super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>.
        _M_impl.super__Vector_impl_data._M_start[(this->color).m_Size.x * lVar8 + lVar9] =
             (oth->color).m_Data.super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>.
             _M_impl.super__Vector_impl_data._M_start[(oth->color).m_Size.x * lVar8 + lVar9];
        pRVar3[lVar10] = pRVar4[lVar11];
      }
    }
  }
  return this;
}

Assistant:

DepthImage &DepthImage::operator+=(const DepthImage &oth) {

    auto w = color.Width();
    auto h = color.Height();

    for (int y = 0; y < h; ++y) {
        for (int x = 0; x < w; ++x) {

            // c - color, d - depth

            // My data
            auto &c_me = color.PixelAt(x, y);
            auto &d_me = depth.PixelAt(x, y);

            // Oth data
            const auto &c_oth = oth.color.PixelAt(x, y);
            const auto &d_oth = oth.depth.PixelAt(x, y);

            // Depth test
            if (d_me.r < d_oth.r) {
                c_me = c_oth;
                d_me = d_oth;
            }
        }
    }

    return *this;
}